

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprClearPoslists(Fts5ExprNode *pNode)

{
  int i;
  long lVar1;
  
  if ((pNode->eType == 4) || (pNode->eType == 9)) {
    (pNode->pNear->apPhrase[0]->poslist).n = 0;
  }
  else {
    for (lVar1 = 0; lVar1 < pNode->nChild; lVar1 = lVar1 + 1) {
      fts5ExprClearPoslists(pNode->apChild[lVar1]);
    }
  }
  return;
}

Assistant:

static void fts5ExprClearPoslists(Fts5ExprNode *pNode){
  if( pNode->eType==FTS5_TERM || pNode->eType==FTS5_STRING ){
    pNode->pNear->apPhrase[0]->poslist.n = 0;
  }else{
    int i;
    for(i=0; i<pNode->nChild; i++){
      fts5ExprClearPoslists(pNode->apChild[i]);
    }
  }
}